

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matches(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        *this,char *name)

{
  bool bVar1;
  bool local_21;
  char *name_local;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  
  bVar1 = matches(this,(TokenType)"$identifier");
  local_21 = false;
  if (bVar1) {
    local_21 = std::operator==(&this->currentStringValue,name);
  }
  return local_21;
}

Assistant:

bool matches (const char* name) const                       { return matches (Token::identifier) && currentStringValue == name; }